

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::cord_internal::CordzHandle::CordzHandle(CordzHandle *this,bool is_snapshot)

{
  __pointer_type pCVar1;
  CordzHandle *dq_tail;
  MutexLock lock;
  Queue *global_queue;
  bool is_snapshot_local;
  CordzHandle *this_local;
  
  this->_vptr_CordzHandle = (_func_int **)&PTR__CordzHandle_00a40f10;
  this->is_snapshot_ = is_snapshot;
  this->dq_prev_ = (CordzHandle *)0x0;
  this->dq_next_ = (CordzHandle *)0x0;
  lock.mu_ = &anon_unknown_0::GlobalQueue()->mutex;
  if (is_snapshot) {
    MutexLock::MutexLock((MutexLock *)&dq_tail,lock.mu_);
    pCVar1 = std::atomic<absl::lts_20250127::cord_internal::CordzHandle_*>::load
                       ((atomic<absl::lts_20250127::cord_internal::CordzHandle_*> *)(lock.mu_ + 1),
                        memory_order_acquire);
    if (pCVar1 != (__pointer_type)0x0) {
      this->dq_prev_ = pCVar1;
      pCVar1->dq_next_ = this;
    }
    std::atomic<absl::lts_20250127::cord_internal::CordzHandle_*>::store
              ((atomic<absl::lts_20250127::cord_internal::CordzHandle_*> *)(lock.mu_ + 1),this,
               memory_order_release);
    MutexLock::~MutexLock((MutexLock *)&dq_tail);
  }
  return;
}

Assistant:

CordzHandle::CordzHandle(bool is_snapshot) : is_snapshot_(is_snapshot) {
  Queue& global_queue = GlobalQueue();
  if (is_snapshot) {
    MutexLock lock(&global_queue.mutex);
    CordzHandle* dq_tail = global_queue.dq_tail.load(std::memory_order_acquire);
    if (dq_tail != nullptr) {
      dq_prev_ = dq_tail;
      dq_tail->dq_next_ = this;
    }
    global_queue.dq_tail.store(this, std::memory_order_release);
  }
}